

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_add_golas_heart.cpp
# Opt level: O0

void add_final_fight_update_handler(ROM *rom,Map *map,uint32_t end_cutscene_addr)

{
  initializer_list<md::AddressRegister> __l;
  initializer_list<md::AddressRegister> __l_00;
  initializer_list<md::AddressRegister> __l_01;
  uint32_t uVar1;
  int iVar2;
  size_type sVar3;
  allocator<char> local_5a9;
  string local_5a8;
  allocator<md::AddressRegister> local_581;
  AddressRegister local_580;
  iterator local_570;
  size_type local_568;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_560;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_548;
  allocator<char> local_529;
  string local_528;
  Param local_508 [2];
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  Param local_4a8 [2];
  allocator<char> local_491;
  string local_490;
  DataRegister local_470;
  allocator<char> local_459;
  string local_458;
  Param local_438 [2];
  Param local_428 [2];
  Param local_418 [2];
  Param local_408 [2];
  allocator<char> local_3f1;
  string local_3f0;
  Param local_3d0 [2];
  allocator<char> local_3b9;
  string local_3b8;
  allocator<char> local_391;
  string local_390;
  Param local_370 [2];
  allocator<char> local_359;
  string local_358;
  Param local_338 [2];
  Param local_328 [2];
  DataRegister local_318;
  Param local_308 [2];
  uint local_2f4;
  undefined1 local_2f0 [4];
  uint32_t offset;
  DataRegister local_2e0;
  AddressRegister local_2d0;
  AddressWithIndex local_2c0;
  AddressRegister local_2a0;
  DataRegister local_290;
  DataRegister local_280;
  DataRegister local_270;
  Param local_260 [2];
  allocator<char> local_249;
  string local_248;
  allocator<md::AddressRegister> local_221;
  AddressRegister local_220;
  iterator local_210;
  size_type local_208;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_200;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_1e8;
  allocator<char> local_1c9;
  string local_1c8;
  DataRegister local_1a8;
  DataRegister local_198;
  Param local_188 [2];
  Param local_178 [2];
  DataRegister local_168;
  allocator<md::AddressRegister> local_151;
  AddressRegister local_150;
  iterator local_140;
  size_type local_138;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_130;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_118;
  undefined1 local_f8 [8];
  Code proc;
  string local_78;
  uint32_t local_54;
  byte local_4d;
  uint32_t palette_sequence_addr;
  uint8_t byte_1;
  byte local_39;
  undefined1 local_38 [7];
  uint8_t byte;
  ByteArray palette_sequence;
  uint8_t VULNERABILITY_THRESHOLD;
  uint8_t PEAK_COLOR;
  uint32_t end_cutscene_addr_local;
  Map *map_local;
  ROM *rom_local;
  
  palette_sequence.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._3_1_ = 0xc;
  palette_sequence.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._2_1_ = 8;
  palette_sequence.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = end_cutscene_addr;
  ByteArray::ByteArray((ByteArray *)local_38);
  for (local_39 = 0; local_39 < 0xd; local_39 = local_39 + 2) {
    ByteArray::add_byte((ByteArray *)local_38,local_39);
  }
  for (local_4d = 10; 1 < local_4d; local_4d = local_4d - 2) {
    ByteArray::add_byte((ByteArray *)local_38,local_4d);
  }
  while (sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38),
        sVar3 < 0x20) {
    ByteArray::add_byte((ByteArray *)local_38,'\0');
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"",
             (allocator<char> *)
             ((long)&proc._labels._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  uVar1 = md::ROM::inject_bytes
                    (rom,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,&local_78
                    );
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&proc._labels._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  local_54 = uVar1;
  md::Code::Code((Code *)local_f8);
  local_118.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector(&local_118);
  md::AddressRegister::AddressRegister(&local_150,'\0');
  local_140 = &local_150;
  local_138 = 1;
  std::allocator<md::AddressRegister>::allocator(&local_151);
  __l_01._M_len = local_138;
  __l_01._M_array = local_140;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_130,__l_01,&local_151);
  md::Code::movem_to_stack((Code *)local_f8,&local_118,&local_130);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_130);
  std::allocator<md::AddressRegister>::~allocator(&local_151);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_118);
  md::DataRegister::DataRegister(&local_168,'\0');
  md::Code::clrl((Code *)local_f8,(Param *)&local_168);
  addr_<void>((uint32_t)local_178,0xff001c);
  md::Code::addib((Code *)local_f8,'\x01',local_178);
  addr_<void>((uint32_t)local_188,0xff001c);
  md::DataRegister::DataRegister(&local_198,'\0');
  md::Code::moveb((Code *)local_f8,local_188,(Param *)&local_198);
  md::DataRegister::DataRegister(&local_1a8,'\0');
  md::Code::andib((Code *)local_f8,'\x01',(Param *)&local_1a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"continue",&local_1c9);
  md::Code::beq((Code *)local_f8,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  local_1e8.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector(&local_1e8);
  md::AddressRegister::AddressRegister(&local_220,'\0');
  local_210 = &local_220;
  local_208 = 1;
  std::allocator<md::AddressRegister>::allocator(&local_221);
  __l_00._M_len = local_208;
  __l_00._M_array = local_210;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_200,__l_00,&local_221);
  md::Code::movem_from_stack((Code *)local_f8,&local_1e8,&local_200);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_200);
  std::allocator<md::AddressRegister>::~allocator(&local_221);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_1e8);
  md::Code::rts((Code *)local_f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"continue",&local_249);
  md::Code::label((Code *)local_f8,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  addr_<void>((uint32_t)local_260,0xff001c);
  md::DataRegister::DataRegister(&local_270,'\0');
  md::Code::moveb((Code *)local_f8,local_260,(Param *)&local_270);
  md::DataRegister::DataRegister(&local_280,'\0');
  md::Code::lsrb((Code *)local_f8,'\x02',&local_280);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  md::DataRegister::DataRegister(&local_290,'\0');
  md::Code::andib((Code *)local_f8,(char)sVar3 + 0xff,(Param *)&local_290);
  uVar1 = local_54;
  md::AddressRegister::AddressRegister(&local_2a0,'\0');
  md::Code::lea((Code *)local_f8,uVar1,&local_2a0);
  md::AddressRegister::AddressRegister(&local_2d0,'\0');
  md::DataRegister::DataRegister(&local_2e0,'\0');
  addr_<void>(&local_2c0,&local_2d0,&local_2e0,'\0',LONG);
  md::DataRegister::DataRegister((DataRegister *)local_2f0,'\0');
  md::Code::moveb((Code *)local_f8,&local_2c0.super_Param,(Param *)local_2f0);
  for (local_2f4 = 0x20; local_2f4 < 0x40; local_2f4 = local_2f4 + 2) {
    iVar2 = local_2f4 * 0x10000;
    addr_<void>((uint32_t)local_308,0xc00004);
    md::Code::movel((Code *)local_f8,iVar2 + 0xc0000000,local_308);
    md::DataRegister::DataRegister(&local_318,'\0');
    addr_<void>((uint32_t)local_328,0xc00000);
    md::Code::movew((Code *)local_f8,(Param *)&local_318,local_328);
  }
  addr_<void>((uint32_t)local_338,0xff5480);
  md::Code::cmpiw((Code *)local_f8,0xffff,local_338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"not_removed",&local_359);
  md::Code::bne((Code *)local_f8,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator(&local_359);
  addr_<void>((uint32_t)local_370,0xff001c);
  md::Code::cmpib((Code *)local_f8,'\x02',local_370);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"end",&local_391);
  md::Code::bne((Code *)local_f8,&local_390);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator(&local_391);
  md::Code::jsr((Code *)local_f8,
                palette_sequence.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"not_removed",&local_3b9);
  md::Code::label((Code *)local_f8,&local_3b8);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  addr_<void>((uint32_t)local_3d0,0xff54be);
  md::Code::cmpiw((Code *)local_f8,1,local_3d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"not_defeated",&local_3f1)
  ;
  md::Code::bne((Code *)local_f8,&local_3f0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  addr_<void>((uint32_t)local_408,0xff5480);
  md::Code::movew((Code *)local_f8,0xffff,local_408);
  addr_<void>((uint32_t)local_418,0xff001c);
  md::Code::moveb((Code *)local_f8,'\0',local_418);
  addr_<void>((uint32_t)local_428,0xff1153);
  md::Code::moveb((Code *)local_f8,'\a',local_428);
  addr_<void>((uint32_t)local_438,0xff540c);
  md::Code::moveb((Code *)local_f8,'\x01',local_438);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_458,"not_defeated",&local_459)
  ;
  md::Code::label((Code *)local_f8,&local_458);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator(&local_459);
  md::DataRegister::DataRegister(&local_470,'\0');
  md::Code::cmpib((Code *)local_f8,'\b',(Param *)&local_470);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"vulnerable",&local_491);
  md::Code::bge((Code *)local_f8,&local_490);
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator(&local_491);
  addr_<void>((uint32_t)local_4a8,0xff54b8);
  md::Code::moveb((Code *)local_f8,'\x01',local_4a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,"end",&local_4c9);
  md::Code::bra((Code *)local_f8,&local_4c8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,"vulnerable",&local_4f1);
  md::Code::label((Code *)local_f8,&local_4f0);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  addr_<void>((uint32_t)local_508,0xff54b8);
  md::Code::moveb((Code *)local_f8,'\0',local_508);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,"end",&local_529);
  md::Code::label((Code *)local_f8,&local_528);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator(&local_529);
  local_548.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_548.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_548.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector(&local_548);
  md::AddressRegister::AddressRegister(&local_580,'\0');
  local_570 = &local_580;
  local_568 = 1;
  std::allocator<md::AddressRegister>::allocator(&local_581);
  __l._M_len = local_568;
  __l._M_array = local_570;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_560,__l,&local_581);
  md::Code::movem_from_stack((Code *)local_f8,&local_548,&local_560);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_560);
  std::allocator<md::AddressRegister>::~allocator(&local_581);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_548);
  md::Code::rts((Code *)local_f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a8,"",&local_5a9);
  uVar1 = md::ROM::inject_code(rom,(Code *)local_f8,&local_5a8);
  Map::map_update_addr(map,uVar1);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator(&local_5a9);
  md::Code::~Code((Code *)local_f8);
  ByteArray::~ByteArray((ByteArray *)local_38);
  return;
}

Assistant:

static void add_final_fight_update_handler(md::ROM& rom, Map* map, uint32_t end_cutscene_addr)
{
    constexpr uint8_t PEAK_COLOR = 0xC;
    constexpr uint8_t VULNERABILITY_THRESHOLD = 0x8;

    ByteArray palette_sequence;
    for(uint8_t byte = 0x00 ; byte <= PEAK_COLOR ; byte += 0x02)
        palette_sequence.add_byte(byte);
    for(uint8_t byte = PEAK_COLOR - 0x02 ; byte >= 0x02 ; byte -= 0x02)
        palette_sequence.add_byte(byte);
    while(palette_sequence.size() < 32)
        palette_sequence.add_byte(0);

    uint32_t palette_sequence_addr = rom.inject_bytes(palette_sequence);

    md::Code proc;
    {
        proc.movem_to_stack({}, { reg_A0 });
        {
            proc.clrl(reg_D0);
            proc.addib(1, addr_(0xFF001C));
            proc.moveb(addr_(0xFF001C), reg_D0);
            proc.andib(0x01, reg_D0);
            proc.beq("continue");
            {
                proc.movem_from_stack({}, { reg_A0 });
                proc.rts();
            }
            proc.label("continue");
            proc.moveb(addr_(0xFF001C), reg_D0);
            proc.lsrb(2, reg_D0);
            proc.andib(palette_sequence.size()-1, reg_D0);
            proc.lea(palette_sequence_addr, reg_A0);
            proc.moveb(addr_(reg_A0, reg_D0), reg_D0);
            for(uint32_t offset = 0x20 ; offset < 0x40 ; offset += 0x2)
            {
                proc.movel(0xC0000000 + (offset * 0x10000), addr_(0xC00004)); // Write CRAM
                proc.movew(reg_D0, addr_(0xC00000));
            }

            proc.cmpiw(0xFFFF, addr_(0xFF5480));
            proc.bne("not_removed");
            {
                proc.cmpib(2, addr_(0xFF001C));
                proc.bne("end");
                proc.jsr(end_cutscene_addr);
            }
            proc.label("not_removed");
            proc.cmpiw(0x0001, addr_(0xFF54BE));
            proc.bne("not_defeated");
            {
                // If Nole is defeated, remove it
                proc.movew(0xFFFF, addr_(0xFF5480));
                proc.moveb(0x00, addr_(0xFF001C));
                proc.moveb(0x7, addr_(0xFF1153)); // Prevent player from attacking & opening menu
                proc.moveb(0x1, addr_(0xFF540C)); // Freeze Nigel animation
            }
            proc.label("not_defeated");
            proc.cmpib(VULNERABILITY_THRESHOLD, reg_D0);
            proc.bge("vulnerable");
            {
                proc.moveb(0x01, addr_(0xFF54B8)); // Make Nole invicible
                proc.bra("end");
            }
            proc.label("vulnerable");
            {
                proc.moveb(0x00, addr_(0xFF54B8)); // Make Nole vulnerable
            }
        }
        proc.label("end");
        proc.movem_from_stack({}, { reg_A0 });
        proc.rts();
    }

    map->map_update_addr(rom.inject_code(proc));
}